

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZCompMesh_*,_3>::TPZManVector
          (TPZManVector<TPZCompMesh_*,_3> *this,int64_t size,TPZCompMesh **copy)

{
  TPZCompMesh **ppTVar1;
  long lVar2;
  int64_t iVar3;
  
  TPZVec<TPZCompMesh_*>::TPZVec(&this->super_TPZVec<TPZCompMesh_*>,0);
  (this->super_TPZVec<TPZCompMesh_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815fe8;
  if (size < 4) {
    ppTVar1 = this->fExtAlloc;
    iVar3 = 0;
  }
  else {
    ppTVar1 = (TPZCompMesh **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    iVar3 = size;
  }
  (this->super_TPZVec<TPZCompMesh_*>).fStore = ppTVar1;
  (this->super_TPZVec<TPZCompMesh_*>).fNElements = size;
  (this->super_TPZVec<TPZCompMesh_*>).fNAlloc = iVar3;
  lVar2 = 0;
  if (size < 1) {
    size = lVar2;
  }
  for (; size != lVar2; lVar2 = lVar2 + 1) {
    (this->super_TPZVec<TPZCompMesh_*>).fStore[lVar2] = *copy;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}